

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lumeview.cpp
# Opt level: O0

void lumeview::LumeviewInit(void)

{
  int iVar1;
  ostream *this;
  LumeviewError *this_00;
  string local_1c0 [48];
  stringstream local_190 [8];
  stringstream ss;
  ostream local_180 [376];
  
  lume::SubsetInfoAnnex::set_imgui_executor(SubsetInfoAnnex_ImGui);
  iVar1 = gladLoadGL();
  if (iVar1 == 0) {
    std::__cxx11::stringstream::stringstream(local_190);
    this = std::operator<<(local_180,"GLAD::INITIALIZATION\n  Failed to initialize GLAD");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringstream::str();
    LumeviewError::LumeviewError(this_00,local_1c0);
    __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
  }
  ImGui_Init((char *)0x0);
  return;
}

Assistant:

void LumeviewInit ()
{
	SubsetInfoAnnex::set_imgui_executor (&SubsetInfoAnnex_ImGui);

	// if (!gladLoadGLLoader ((GLADloadproc)glfwGetProcAddress)) {
	// 	THROW("GLAD::INITIALIZATION\n  Failed to initialize GLAD" << endl);
	// }

	if (!gladLoadGL ()) {
		THROW("GLAD::INITIALIZATION\n  Failed to initialize GLAD" << endl);
	}

	lumeview::ImGui_Init();
}